

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObjectStore.cpp
# Opt level: O0

void __thiscall SessionObjectStore::allSessionsClosed(SessionObjectStore *this,CK_SLOT_ID slotID)

{
  bool bVar1;
  long in_RDI;
  iterator i;
  set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> checkObjects;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff68;
  MutexLocker *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  _Self local_70;
  _Self local_68 [13];
  
  MutexLocker::MutexLocker(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::set
            ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff70,
             (set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff68);
  local_68[0]._M_node =
       (_Base_ptr)
       std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::
       begin((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff68);
  while( true ) {
    local_70._M_node =
         (_Base_ptr)
         std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::
         end((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(local_68,&local_70);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<SessionObject_*>::operator*
              ((_Rb_tree_const_iterator<SessionObject_*> *)in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff7f =
         SessionObject::removeOnAllSessionsClose
                   ((SessionObject *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                    (CK_SLOT_ID)in_stack_ffffffffffffff70);
    if ((bool)in_stack_ffffffffffffff7f) {
      in_stack_ffffffffffffff70 = (MutexLocker *)(in_RDI + 8);
      std::_Rb_tree_const_iterator<SessionObject_*>::operator*
                ((_Rb_tree_const_iterator<SessionObject_*> *)in_stack_ffffffffffffff70);
      std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::erase
                ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>
                  *)in_stack_ffffffffffffff70,(key_type *)in_stack_ffffffffffffff68);
    }
    std::_Rb_tree_const_iterator<SessionObject_*>::operator++
              ((_Rb_tree_const_iterator<SessionObject_*> *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  }
  std::set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_>::~set
            ((set<SessionObject_*,_std::less<SessionObject_*>,_std::allocator<SessionObject_*>_> *)
             0x1e5a9f);
  MutexLocker::~MutexLocker(in_stack_ffffffffffffff70);
  return;
}

Assistant:

void SessionObjectStore::allSessionsClosed(CK_SLOT_ID slotID)
{
	MutexLocker lock(storeMutex);

	std::set<SessionObject*> checkObjects = objects;

	for (std::set<SessionObject*>::iterator i = checkObjects.begin(); i != checkObjects.end(); i++)
	{
		if ((*i)->removeOnAllSessionsClose(slotID))
		{
			// Since the object remains in the allObjects set, any pointers to it will
			// remain valid but it will no longer be returned when the set of objects
			// is requested
			objects.erase(*i);
		}
	}
}